

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

int fits_hcompress(int *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *tmp;
  void *__src;
  ulong uVar5;
  sbyte sVar6;
  int iVar7;
  char cVar8;
  undefined4 in_register_00000014;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  sbyte sVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  char *pcVar19;
  int iVar20;
  uint uVar21;
  int *piVar22;
  int ny2;
  long lVar23;
  long lVar24;
  int *piVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  bool bVar31;
  undefined2 local_db;
  byte local_d9;
  int *local_d8;
  uint local_cc;
  uint local_c8;
  int local_c4;
  char *local_c0;
  ulong local_b8;
  ulong local_b0;
  double local_a8;
  ulong local_a0;
  long *local_98;
  int local_90;
  uint local_8c;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int vmax [3];
  
  if (0 < *status) {
    return *status;
  }
  uVar28 = (ulong)(uint)ny;
  iVar18 = ny;
  if (ny < nx) {
    iVar18 = nx;
  }
  local_d8 = a;
  local_c0 = output;
  local_98 = nbytes;
  local_a8 = log((double)iVar18);
  tmp = (int *)malloc((long)((iVar18 + 1) / 2) << 2);
  piVar22 = local_d8;
  if (tmp == (int *)0x0) {
    ffpmsg("htrans: insufficient memory");
    iVar18 = 0x19d;
    goto LAB_001b2c3f;
  }
  local_7c = (int)(local_a8 / 0.6931471805599453 + 0.5);
  local_c4 = 1;
  local_7c = (uint)(1 << ((byte)local_7c & 0x1f) < iVar18) + local_7c;
  local_70 = ny * 2;
  if (local_7c < 1) {
    local_7c = 0;
  }
  local_b0 = 0xfffffffffffffffc;
  uVar11 = 0xfffffffffffffffe;
  iVar18 = 0;
  uVar16 = 0;
  local_b8 = 2;
  uVar5 = 1;
  local_cc = ny;
  local_c8 = nx;
  local_a0 = CONCAT44(in_register_00000014,nx);
  local_88 = uVar28;
  while( true ) {
    iVar3 = (int)uVar5;
    iVar4 = (int)uVar28;
    if (iVar18 == local_7c) break;
    local_78 = (int)local_c8 % 2;
    local_90 = (int)local_cc % 2;
    local_6c = local_c8 - local_78;
    iVar17 = local_cc - local_90;
    local_a8 = (double)CONCAT44(local_a8._4_4_,iVar17);
    local_8c = uVar16 ^ 1;
    uVar5 = uVar28 & 0xffffffff;
    iVar4 = 0;
    iVar12 = 0;
    while( true ) {
      iVar20 = iVar4;
      lVar23 = (long)iVar20;
      uVar21 = (uint)uVar11;
      sVar15 = (sbyte)uVar16;
      sVar6 = (sbyte)local_8c;
      if (local_6c <= iVar12) break;
      lVar24 = lVar23 << 0x20;
      local_64 = (int)uVar5;
      lVar13 = (long)local_64;
      lVar14 = lVar13 << 0x20;
      for (lVar9 = 0; (int)lVar9 < iVar17; lVar9 = lVar9 + 2) {
        iVar4 = piVar22[lVar13 + lVar9] + piVar22[lVar13 + lVar9 + 1];
        iVar2 = piVar22[lVar23 + lVar9];
        iVar7 = piVar22[lVar23 + lVar9 + 1];
        iVar10 = piVar22[lVar13 + lVar9 + 1] - piVar22[lVar13 + lVar9];
        iVar30 = iVar2 + iVar7 + iVar4 >> sVar15;
        iVar26 = iVar4 - (iVar2 + iVar7) >> sVar15;
        iVar27 = (iVar10 + iVar7) - iVar2 >> sVar15;
        piVar22[lVar13 + lVar9 + 1] = (iVar10 - iVar7) + iVar2 >> sVar15;
        iVar4 = iVar3;
        if (iVar26 < 0) {
          iVar4 = 0;
        }
        piVar22[lVar13 + lVar9] = iVar4 + iVar26 & uVar21;
        iVar4 = iVar3;
        if (iVar27 < 0) {
          iVar4 = 0;
        }
        piVar22[lVar23 + lVar9 + 1] = iVar4 + iVar27 & uVar21;
        iVar4 = (int)local_b8;
        if (iVar30 < 0) {
          iVar4 = local_c4;
        }
        piVar22[lVar23 + lVar9] = iVar4 + iVar30 & (uint)local_b0;
        lVar24 = lVar24 + 0x200000000;
        lVar14 = lVar14 + 0x200000000;
      }
      if (local_90 != 0) {
        iVar2 = *(int *)((long)local_d8 + (lVar14 >> 0x1e));
        iVar7 = *(int *)((long)local_d8 + (lVar24 >> 0x1e));
        iVar4 = iVar7 + iVar2;
        iVar2 = iVar2 - iVar7;
        iVar7 = iVar3;
        if (iVar2 << sVar6 < 0) {
          iVar7 = 0;
        }
        iVar10 = (int)local_b8;
        if (iVar4 << sVar6 < 0) {
          iVar10 = local_c4;
        }
        *(uint *)((long)local_d8 + (lVar14 >> 0x1e)) = iVar7 + (iVar2 << sVar6) & uVar21;
        *(uint *)((long)local_d8 + (lVar24 >> 0x1e)) = iVar10 + (iVar4 << sVar6) & (uint)local_b0;
      }
      uVar5 = (ulong)(uint)(local_64 + local_70);
      uVar28 = local_88;
      iVar4 = iVar20 + local_70;
      local_68 = iVar12;
      local_60 = iVar20;
      iVar12 = iVar12 + 2;
    }
    if (local_78 != 0) {
      lVar13 = lVar23 << 0x20;
      for (lVar9 = 0; (int)lVar9 < iVar17; lVar9 = lVar9 + 2) {
        iVar4 = piVar22[lVar23 + lVar9] + piVar22[lVar23 + lVar9 + 1];
        iVar20 = piVar22[lVar23 + lVar9 + 1] - piVar22[lVar23 + lVar9] << sVar6;
        iVar12 = iVar3;
        if (iVar20 < 0) {
          iVar12 = 0;
        }
        piVar22[lVar23 + lVar9 + 1] = iVar12 + iVar20 & uVar21;
        iVar12 = (int)local_b8;
        if (iVar4 << sVar6 < 0) {
          iVar12 = local_c4;
        }
        piVar22[lVar23 + lVar9] = iVar12 + (iVar4 << sVar6) & (uint)local_b0;
        lVar13 = lVar13 + 0x200000000;
      }
      if (local_90 != 0) {
        iVar3 = *(int *)((long)local_d8 + (lVar13 >> 0x1e));
        bVar1 = 2U - sVar15 & 0x1f;
        iVar4 = local_c4;
        if (-1 < iVar3 << bVar1) {
          iVar4 = (int)local_b8;
        }
        *(uint *)((long)local_d8 + (lVar13 >> 0x1e)) = iVar4 + (iVar3 << bVar1) & (uint)local_b0;
      }
    }
    uVar11 = 0;
    piVar25 = local_d8;
    local_74 = iVar18;
    if (0 < (int)local_c8) {
      uVar11 = (ulong)local_c8;
    }
    while( true ) {
      bVar31 = uVar11 == 0;
      uVar11 = uVar11 - 1;
      uVar16 = 1;
      if (bVar31) break;
      shuffle(piVar25,local_cc,1,tmp);
      piVar25 = piVar25 + ny;
    }
    uVar11 = 0;
    piVar25 = local_d8;
    if (0 < (int)local_cc) {
      uVar11 = (ulong)local_cc;
    }
    while (bVar31 = uVar11 != 0, uVar11 = uVar11 - 1, bVar31) {
      shuffle(piVar25,local_c8,(int)uVar28,tmp);
      piVar25 = piVar25 + 1;
    }
    local_c8 = (int)(local_c8 + 1) >> 1;
    local_cc = (int)(local_cc + 1) >> 1;
    uVar11 = local_b0 & 0xffffffff;
    local_b0 = (ulong)(uint)((int)local_b0 * 2);
    local_c4 = (int)local_b8 * 2 + -1;
    iVar18 = local_74 + 1;
    uVar5 = local_b8;
    local_b8 = (ulong)(uint)((int)local_b8 * 2);
  }
  free(tmp);
  pcVar19 = local_c0;
  iVar18 = (int)local_a0;
  if (1 < scale) {
    uVar16 = scale + 1U >> 1;
    for (piVar22 = local_d8; piVar22 <= local_d8 + (long)(iVar18 * iVar4) + -1;
        piVar22 = piVar22 + 1) {
      iVar3 = 1 - uVar16;
      if (0 < *piVar22) {
        iVar3 = uVar16 - 1;
      }
      *piVar22 = (iVar3 + *piVar22) / scale;
    }
  }
  uVar16 = iVar18 * iVar4;
  lVar23 = *local_98;
  noutmax = lVar23;
  *local_98 = 0;
  noutchar = 0;
  if (1 < lVar23) {
    local_c0[0] = -0x23;
    local_c0[1] = -0x67;
    noutchar = 2;
  }
  writeint(local_c0,iVar18);
  writeint(pcVar19,iVar4);
  writeint(pcVar19,scale);
  piVar22 = local_d8;
  writelonglong(pcVar19,(long)*local_d8);
  *piVar22 = 0;
  __src = calloc(1,(long)((int)(uVar16 + 7) / 8));
  uVar28 = local_88;
  if (__src == (void *)0x0) {
    pcVar19 = "encode: insufficient memory";
  }
  else {
    uVar5 = 0;
    uVar11 = (ulong)uVar16;
    if ((int)uVar16 < 1) {
      uVar11 = uVar5;
    }
    uVar29 = 0;
    iVar18 = 8;
    for (; uVar16 = (uint)uVar29, uVar11 != uVar5; uVar5 = uVar5 + 1) {
      iVar3 = local_d8[uVar5];
      if (iVar3 < 1) {
        if (iVar3 < 0) {
          *(char *)((long)__src + uVar29) = *(char *)((long)__src + uVar29) * '\x02' + '\x01';
          iVar18 = iVar18 + -1;
          local_d8[uVar5] = -iVar3;
        }
      }
      else {
        *(char *)((long)__src + uVar29) = *(char *)((long)__src + uVar29) << 1;
        iVar18 = iVar18 + -1;
      }
      bVar31 = iVar18 == 0;
      if (bVar31) {
        iVar18 = 8;
      }
      uVar29 = (ulong)(uVar16 + bVar31);
    }
    if (iVar18 != 8) {
      *(char *)((long)__src + uVar29) = *(char *)((long)__src + uVar29) << ((byte)iVar18 & 0x1f);
      uVar16 = uVar16 + 1;
    }
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      vmax[lVar23] = 0;
    }
    iVar12 = ((int)local_a0 + 1) / 2;
    iVar3 = (int)local_88;
    iVar4 = (iVar3 + 1) / 2;
    iVar18 = 0;
    iVar17 = 0;
    for (uVar5 = 0; uVar11 != uVar5; uVar5 = uVar5 + 1) {
      uVar21 = (uint)(iVar12 <= iVar17) + (uint)(iVar4 <= iVar18);
      iVar20 = local_d8[uVar5];
      if (local_d8[uVar5] < vmax[uVar21]) {
        iVar20 = vmax[uVar21];
      }
      vmax[uVar21] = iVar20;
      iVar20 = iVar18 + 1;
      iVar18 = iVar20;
      if (iVar3 <= iVar20) {
        iVar18 = 0;
      }
      iVar17 = iVar17 + (uint)(iVar3 <= iVar20);
    }
    for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
      cVar8 = '\0';
      for (uVar21 = vmax[lVar23]; 0 < (int)uVar21; uVar21 = uVar21 >> 1) {
        cVar8 = cVar8 + '\x01';
      }
      *(char *)((long)&local_db + lVar23) = cVar8;
      vmax[lVar23] = uVar21;
    }
    lVar23 = noutchar;
    if (noutmax < noutchar + 3) {
LAB_001b2c19:
      *local_98 = lVar23;
      pcVar19 = "encode: output buffer too small";
    }
    else {
      local_c0[noutchar + 2] = local_d9;
      *(undefined2 *)(local_c0 + noutchar) = local_db;
      buffer2 = 0;
      bits_to_go2 = 8;
      bitcount = 0;
      noutchar = noutchar + 3;
      iVar18 = qtree_encode(local_c0,local_d8,iVar3,iVar12,iVar4,(uint)(byte)local_db);
      if (iVar18 == 0) {
        iVar18 = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar28 & 0xffffffff) / 2);
        local_b0 = CONCAT44(local_b0._4_4_,iVar18);
        local_a8 = (double)CONCAT44(local_a8._4_4_,(uint)local_db._1_1_);
        iVar18 = qtree_encode(local_c0,local_d8 + iVar4,iVar3,iVar12,iVar18,(uint)local_db._1_1_);
        if (iVar18 == 0) {
          iVar18 = (int)((long)((ulong)(uint)((int)local_a0 >> 0x1f) << 0x20 | local_a0 & 0xffffffff
                               ) / 2);
          local_b8 = CONCAT44(local_b8._4_4_,iVar18);
          iVar18 = qtree_encode(local_c0,local_d8 + iVar12 * iVar3,iVar3,iVar18,iVar4,local_a8._0_4_
                               );
          if (iVar18 == 0) {
            iVar18 = qtree_encode(local_c0,local_d8 + (iVar12 * iVar3 + iVar4),iVar3,(int)local_b8,
                                  (uint)local_b0,(uint)local_d9);
          }
        }
      }
      pcVar19 = local_c0;
      output_nybble(local_c0,0);
      done_outputing_bits(pcVar19);
      lVar23 = noutchar;
      lVar9 = noutmax;
      if (0 < (int)uVar16) {
        lVar13 = noutchar + (ulong)uVar16;
        if (noutmax < lVar13) {
          free(__src);
          goto LAB_001b2c19;
        }
        memcpy(local_c0 + noutchar,__src,(ulong)uVar16);
        noutchar = lVar13;
      }
      lVar23 = noutchar;
      free(__src);
      *local_98 = lVar23;
      if (lVar23 < lVar9) goto LAB_001b2c3f;
      pcVar19 = "encode: output buffer too small";
    }
  }
  ffpmsg(pcVar19);
  iVar18 = 0x19d;
LAB_001b2c3f:
  *status = iVar18;
  return iVar18;
}

Assistant:

int fits_hcompress(int *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - input value = size of the output buffer;
            returned value = size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;
  
  *status = stat;
  return(*status);
}